

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

QString * __thiscall
QAccessibleComboBox::text(QString *__return_storage_ptr__,QAccessibleComboBox *this,Text t)

{
  char16_t *pcVar1;
  long lVar2;
  bool bVar3;
  QComboBox *this_00;
  QLineEdit *this_01;
  QArrayData *pQVar4;
  longlong __tmp;
  long in_FS_OFFSET;
  QKeySequence local_50 [8];
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  if (this_00 == (QComboBox *)0x0) goto LAB_0051fba4;
  if (t == Name) {
LAB_0051fa72:
    bVar3 = QComboBox::isEditable(this_00);
    if (bVar3) {
      this_01 = QComboBox::lineEdit(this_00);
      QLineEdit::text(&local_48,this_01);
      pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar1 = (__return_storage_ptr__->d).ptr;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.d.ptr._4_4_;
      lVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_48.d.size;
      local_48.d.ptr = pcVar1;
      local_48.d.size = lVar2;
    }
    else {
      QComboBox::currentText(&local_48,this_00);
      pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar1 = (__return_storage_ptr__->d).ptr;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.d.ptr._4_4_;
      lVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_48.d.size;
      local_48.d.ptr = pcVar1;
      local_48.d.size = lVar2;
    }
    local_48.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  else if (t == Accelerator) {
    QKeySequence::QKeySequence(local_50,0x1000015,0,0,0);
    QKeySequence::toString((SequenceFormat)&local_48);
    pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d.d;
    (__return_storage_ptr__->d).ptr = local_48.d.ptr;
    lVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = (Data *)pQVar4;
    local_48.d.ptr = pcVar1;
    local_48.d.size = lVar2;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    QKeySequence::~QKeySequence(local_50);
  }
  else if (t == Value) goto LAB_0051fa72;
  lVar2 = (__return_storage_ptr__->d).size;
  if (lVar2 == 0) {
    QAccessibleWidget::text(&local_48,&this->super_QAccessibleWidget,t);
    pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.d.ptr._4_4_;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = (Data *)pQVar4;
    local_48.d.ptr = pcVar1;
    local_48.d.size = lVar2;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
LAB_0051fba4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleComboBox::text(QAccessible::Text t) const
{
    QString str;
    if (QComboBox *cBox = comboBox()) {
        switch (t) {
        case QAccessible::Name:
#ifndef Q_OS_UNIX // on Linux we use relations for this, name is text (fall through to Value)
        str = QAccessibleWidget::text(t);
        break;
#endif
        case QAccessible::Value:
            if (cBox->isEditable())
                str = cBox->lineEdit()->text();
            else
                str = cBox->currentText();
            break;
#ifndef QT_NO_SHORTCUT
        case QAccessible::Accelerator:
            str = QKeySequence(Qt::Key_Down).toString(QKeySequence::NativeText);
            break;
#endif
        default:
            break;
        }
        if (str.isEmpty())
            str = QAccessibleWidget::text(t);
    }
    return str;
}